

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall UDPPacketWriter::UDPPacketWriter(UDPPacketWriter *this,Socket *socket,int buf_size)

{
  int buf_size_local;
  Socket *socket_local;
  UDPPacketWriter *this_local;
  
  UDPPacketWriter(this,socket->sockfd,buf_size);
  return;
}

Assistant:

UDPPacketWriter::UDPPacketWriter(Socket &socket, int buf_size) : UDPPacketWriter(socket.sockfd, buf_size) {}